

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerCPP::variable_decl
          (string *__return_storage_ptr__,CompilerCPP *this,SPIRType *type,string *name,
          uint32_t param_3)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  size_type *psVar4;
  undefined4 in_register_00000084;
  ulong uVar5;
  string base;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (&local_70,this,type,0,CONCAT44(in_register_00000084,param_3));
  if ((this->super_CompilerGLSL).super_Compiler.variable_remap_callback.super__Function_base.
      _M_manager != (_Manager_type)0x0) {
    (*(this->super_CompilerGLSL).super_Compiler.variable_remap_callback._M_invoker)
              ((_Any_data *)&(this->super_CompilerGLSL).super_Compiler.variable_remap_callback,type,
               name,&local_70);
  }
  uVar2 = (type->array).super_VectorView<unsigned_int>.buffer_size;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      if (((type->array).super_VectorView<unsigned_int>.ptr[uVar5] != 0) ||
         ((type->array_size_literal).super_VectorView<bool>.ptr[uVar5] == false)) {
        CompilerGLSL::to_array_size_abi_cxx11_
                  (&local_50,&this->super_CompilerGLSL,type,(uint32_t)uVar5);
        join<char_const(&)[12],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                  (&local_90,(spirv_cross *)"std::array<",(char (*) [12])&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x394b62,
                   (char (*) [3])&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x395c2f,
                   (char (*) [2])name);
        ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        uVar2 = (type->array).super_VectorView<unsigned_int>.buffer_size;
      }
      uVar5 = (ulong)((uint32_t)uVar5 + 1);
    } while (uVar5 < uVar2);
  }
  ::std::__cxx11::string::push_back((char)&local_70);
  ::std::operator+(&local_90,&local_70,name);
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_90);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerCPP::variable_decl(const SPIRType &type, const string &name, uint32_t /* id */)
{
	string base = type_to_glsl(type);
	remap_variable_type_name(type, name, base);
	bool runtime = false;

	for (uint32_t i = 0; i < type.array.size(); i++)
	{
		auto &array = type.array[i];
		if (!array && type.array_size_literal[i])
		{
			// Avoid using runtime arrays with std::array since this is undefined.
			// Runtime arrays cannot be passed around as values, so this is fine.
			runtime = true;
		}
		else
			base = join("std::array<", base, ", ", to_array_size(type, i), ">");
	}
	base += ' ';
	return base + name + (runtime ? "[1]" : "");
}